

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

bool __thiscall
DCanvas::ParseDrawTextureTags
          (DCanvas *this,FTexture *img,double x,double y,DWORD tag,__va_list_tag *tags,
          DrawParms *parms,bool fortext)

{
  int iVar1;
  uint uVar2;
  FRemapTable *pFVar3;
  bool bVar4;
  FRenderStyle FVar5;
  int *piVar6;
  undefined8 *puVar7;
  FRenderStyle *pFVar8;
  uint32 *puVar9;
  long *plVar10;
  double *pdVar11;
  INTBOOL *pIVar12;
  DWORD *pDVar13;
  int iVar14;
  undefined3 in_register_00000089;
  bool bVar15;
  double dVar16;
  
  if ((((CONCAT31(in_register_00000089,fortext) == 0) &&
       ((img == (FTexture *)0x0 || (img->UseType == '\r')))) || (16383.0 < y)) ||
     ((16383.0 < ABS(x) || (y < -16383.0)))) {
    return false;
  }
  parms->fortext = fortext;
  bVar15 = false;
  parms->windowleft = 0.0;
  parms->windowright = 2147483647.0;
  iVar14 = this->Height;
  parms->dclip = iVar14;
  parms->uclip = 0;
  parms->lclip = 0;
  iVar1 = this->Width;
  parms->rclip = iVar1;
  parms->left = 2147483647.0;
  parms->top = 2147483647.0;
  parms->destwidth = 2147483647.0;
  parms->destheight = 2147483647.0;
  parms->Alpha = 1.0;
  parms->fillcolor = 0xffffffff;
  parms->remap = (FRemapTable *)0x0;
  parms->colorOverlay = 0;
  parms->alphaChannel = 0;
  parms->alphaChannel = 0;
  parms->flipX = 0;
  parms->shadowAlpha = 0;
  parms->shadowColor = 0;
  parms->virtWidth = (double)iVar1;
  parms->virtHeight = (double)iVar14;
  parms->keepratio = 0;
  (parms->style).field_0.BlendOp = 0xff;
  parms->masked = 1;
  parms->bilinear = 0;
  parms->specialcolormap = (FSpecialColormap *)0x0;
  parms->colormapstyle = (FColormapStyle *)0x0;
  parms->cleanmode = 0x40001388;
  parms->scalex = 1;
  parms->scaley = 1;
  parms->celly = 0;
  parms->maxstrlen = 0x7fffffff;
  parms->cellx = 0;
  parms->virtBottom = false;
LAB_0048c793:
  switch(tag) {
  case 0x40001389:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x1e2,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    parms->cleanmode = 0x40001388;
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d400;
  case 0x4000138a:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x1f0,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    parms->cleanmode = 0x40001388;
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d4b8;
  case 0x4000138b:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    iVar14 = 0x10000;
    if (*piVar6 < 0x10000) {
      iVar14 = *piVar6;
    }
    dVar16 = (double)iVar14 * 1.52587890625e-05;
    goto LAB_0048d1f1;
  case 0x4000138c:
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = 1.0;
    if (*pdVar11 <= 1.0) {
      dVar16 = *pdVar11;
    }
LAB_0048d1f1:
    parms->Alpha = (float)dVar16;
    break;
  case 0x4000138d:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar9 = (uint32 *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      puVar9 = (uint32 *)tags->overflow_arg_area;
      tags->overflow_arg_area = puVar9 + 2;
    }
    parms->fillcolor = *puVar9;
    bVar15 = true;
    break;
  case 0x4000138e:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar10 = (long *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      plVar10 = (long *)tags->overflow_arg_area;
      tags->overflow_arg_area = plVar10 + 1;
    }
    pFVar3 = (FRemapTable *)*plVar10;
    parms->remap = pFVar3;
    if ((pFVar3 != (FRemapTable *)0x0) && (pFVar3->Inactive == true)) {
      parms->remap = (FRemapTable *)0x0;
    }
    break;
  case 0x4000138f:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pIVar12 = (INTBOOL *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      pIVar12 = (INTBOOL *)tags->overflow_arg_area;
      tags->overflow_arg_area = pIVar12 + 2;
    }
    parms->alphaChannel = *pIVar12;
    break;
  case 0x40001390:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->scalex = 1;
      parms->scaley = 1;
LAB_0048d177:
      parms->cleanmode = tag;
    }
    break;
  case 0x40001391:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->cleanmode = 0x40001388;
      parms->scalex = 1;
      parms->scaley = 1;
      parms->virtWidth = 320.0;
      parms->virtHeight = 200.0;
    }
    break;
  case 0x40001392:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->cleanmode = 0x40001388;
      parms->scalex = 1;
      parms->scaley = 1;
      parms->virtWidth = 320.0;
      parms->virtHeight = 200.0;
    }
    parms->virtBottom = true;
    break;
  case 0x40001393:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->scalex = CleanXfac;
      iVar14 = CleanYfac;
LAB_0048d171:
      parms->scaley = iVar14;
      goto LAB_0048d177;
    }
    break;
  case 0x40001394:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->scalex = CleanXfac_1;
      iVar14 = CleanYfac_1;
      goto LAB_0048d171;
    }
    break;
  case 0x40001395:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pIVar12 = (INTBOOL *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      pIVar12 = (INTBOOL *)tags->overflow_arg_area;
      tags->overflow_arg_area = pIVar12 + 2;
    }
    parms->flipX = *pIVar12;
    break;
  case 0x40001396:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    parms->shadowColor = *piVar6;
    break;
  case 0x40001397:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    iVar14 = 0x10000;
    if (*piVar6 < 0x10000) {
      iVar14 = *piVar6;
    }
    parms->shadowAlpha = iVar14;
    break;
  case 0x40001398:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 == 0) {
      parms->shadowAlpha = 0;
    }
    else {
      parms->shadowAlpha = 0x8000;
      parms->shadowColor = 0;
    }
    break;
  case 0x40001399:
    parms->cleanmode = 0x40001388;
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d230;
  case 0x4000139a:
    parms->cleanmode = 0x40001388;
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d310;
  case 0x4000139b:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x27b,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d48a;
  case 0x4000139c:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x287,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d45e;
  case 0x4000139d:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x293,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->left = ((double)img->Width / (img->Scale).X) * 0.5;
      dVar16 = ((double)img->Height / (img->Scale).Y) * 0.5;
      goto LAB_0048d48a;
    }
    break;
  case 0x4000139e:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x29d,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 != 0) {
      parms->left = ((double)img->Width / (img->Scale).X) * 0.5;
      dVar16 = (double)img->Height / (img->Scale).Y;
      goto LAB_0048d48a;
    }
    break;
  case 0x4000139f:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x2a7,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d4a1;
  case 0x400013a0:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x2b3,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    dVar16 = (double)*piVar6;
    goto LAB_0048d3e3;
  case 0x400013a1:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    iVar14 = 0;
    if (0 < *piVar6) {
      iVar14 = *piVar6;
    }
    parms->uclip = iVar14;
    break;
  case 0x400013a2:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    iVar14 = *piVar6;
    parms->dclip = iVar14;
    iVar1 = this->Height;
    if (iVar14 < this->Height) {
      iVar1 = iVar14;
    }
    parms->dclip = iVar1;
    break;
  case 0x400013a3:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    iVar14 = 0;
    if (0 < *piVar6) {
      iVar14 = *piVar6;
    }
    parms->lclip = iVar14;
    break;
  case 0x400013a4:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    iVar14 = *piVar6;
    parms->rclip = iVar14;
    iVar1 = this->Width;
    if (iVar14 < this->Width) {
      iVar1 = iVar14;
    }
    parms->rclip = iVar1;
    break;
  case 0x400013a5:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pIVar12 = (INTBOOL *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      pIVar12 = (INTBOOL *)tags->overflow_arg_area;
      tags->overflow_arg_area = pIVar12 + 2;
    }
    parms->masked = *pIVar12;
    break;
  case 0x400013a6:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    parms->cleanmode = *piVar6 == 1 | 0x400013a6;
    break;
  case 0x400013a7:
    goto switchD_0048c7ab_caseD_400013a7;
  case 0x400013a8:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pIVar12 = (INTBOOL *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      pIVar12 = (INTBOOL *)tags->overflow_arg_area;
      tags->overflow_arg_area = pIVar12 + 2;
    }
    parms->keepratio = *pIVar12;
    break;
  case 0x400013a9:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pFVar8 = (FRenderStyle *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      pFVar8 = (FRenderStyle *)tags->overflow_arg_area;
      tags->overflow_arg_area = pFVar8 + 2;
    }
    parms->style = *pFVar8;
    break;
  case 0x400013aa:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar9 = (uint32 *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      puVar9 = (uint32 *)tags->overflow_arg_area;
      tags->overflow_arg_area = puVar9 + 2;
    }
    parms->colorOverlay = *puVar9;
    break;
  case 0x400013ab:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pIVar12 = (INTBOOL *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      pIVar12 = (INTBOOL *)tags->overflow_arg_area;
      tags->overflow_arg_area = pIVar12 + 2;
    }
    parms->bilinear = *pIVar12;
    break;
  case 0x400013ac:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar7 = (undefined8 *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      puVar7 = (undefined8 *)tags->overflow_arg_area;
      tags->overflow_arg_area = puVar7 + 1;
    }
    parms->specialcolormap = (FSpecialColormap *)*puVar7;
    break;
  case 0x400013ad:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar7 = (undefined8 *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      puVar7 = (undefined8 *)tags->overflow_arg_area;
      tags->overflow_arg_area = puVar7 + 1;
    }
    parms->colormapstyle = (FColormapStyle *)*puVar7;
    break;
  case 0x400013ae:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    if (*piVar6 == 0) break;
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x251,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    if (img != (FTexture *)0x0) {
      parms->cleanmode = 0x400013ae;
      parms->virtWidth = (double)img->Width / (img->Scale).X;
      dVar16 = (double)img->Height / (img->Scale).Y;
      goto LAB_0048d310;
    }
    bVar4 = false;
    goto LAB_0048d4e6;
  case 0x400013af:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x1e9,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    parms->cleanmode = 0x40001388;
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d400:
    parms->destwidth = dVar16;
    break;
  case 0x400013b0:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x1f7,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    parms->cleanmode = 0x40001388;
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d4b8:
    parms->destheight = dVar16;
    break;
  case 0x400013b1:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x281,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d48a:
    parms->top = dVar16;
    break;
  case 0x400013b2:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x28d,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d45e:
    parms->left = dVar16;
    break;
  case 0x400013b3:
    parms->cleanmode = 0x40001388;
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d230:
    parms->virtWidth = dVar16;
    break;
  case 0x400013b4:
    parms->cleanmode = 0x40001388;
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d310:
    parms->virtHeight = dVar16;
    break;
  case 0x400013b5:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x2ad,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d4a1:
    parms->windowleft = dVar16;
    break;
  case 0x400013b6:
    if (fortext) {
      __assert_fail("fortext == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x2b9,
                    "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                   );
    }
    uVar2 = tags->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar11 = (double *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar11 = (double *)tags->overflow_arg_area;
      tags->overflow_arg_area = pdVar11 + 1;
    }
    dVar16 = *pdVar11;
LAB_0048d3e3:
    parms->windowright = dVar16;
    break;
  case 0x400013b7:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    parms->maxstrlen = *piVar6;
    break;
  case 0x400013b8:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    parms->cellx = *piVar6;
    break;
  case 0x400013b9:
    uVar2 = tags->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar6 = (int *)((ulong)uVar2 + (long)tags->reg_save_area);
      tags->gp_offset = uVar2 + 8;
    }
    else {
      piVar6 = (int *)tags->overflow_arg_area;
      tags->overflow_arg_area = piVar6 + 2;
    }
    parms->celly = *piVar6;
    break;
  default:
    if (tag == 0) {
      if (parms->dclip <= parms->uclip) {
        return false;
      }
      if (parms->rclip <= parms->lclip) {
        return false;
      }
      if (img != (FTexture *)0x0) {
        SetTextureParms(this,parms,img,x,y);
        if (parms->destwidth <= 0.0) {
          return false;
        }
        if (parms->destheight <= 0.0) {
          return false;
        }
      }
      if ((parms->style).field_0.BlendOp != 0xff) {
        return true;
      }
      if (bVar15) {
        FVar5 = LegacyRenderStyles[8];
        if ((parms->alphaChannel == 0) &&
           (FVar5 = LegacyRenderStyles[5], parms->Alpha <= 1.0 && parms->Alpha != 1.0)) {
          FVar5 = LegacyRenderStyles[9];
        }
      }
      else {
        FVar5 = LegacyRenderStyles[1];
        if (parms->Alpha <= 1.0 && parms->Alpha != 1.0) {
          FVar5 = LegacyRenderStyles[6];
        }
      }
      parms->style = FVar5;
      return true;
    }
    goto switchD_0048c7ab_caseD_400013a7;
  }
LAB_0048d4bd:
  uVar2 = tags->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    pDVar13 = (DWORD *)((ulong)uVar2 + (long)tags->reg_save_area);
    tags->gp_offset = uVar2 + 8;
  }
  else {
    pDVar13 = (DWORD *)tags->overflow_arg_area;
    tags->overflow_arg_area = pDVar13 + 2;
  }
  tag = *pDVar13;
  bVar4 = true;
LAB_0048d4e6:
  if (!bVar4) {
    return false;
  }
  goto LAB_0048c793;
switchD_0048c7ab_caseD_400013a7:
  if (tags->gp_offset < 0x29) {
    tags->gp_offset = tags->gp_offset + 8;
  }
  else {
    tags->overflow_arg_area = (void *)((long)tags->overflow_arg_area + 8);
  }
  goto LAB_0048d4bd;
}

Assistant:

bool DCanvas::ParseDrawTextureTags (FTexture *img, double x, double y, DWORD tag, va_list tags, DrawParms *parms, bool fortext) const
{
	INTBOOL boolval;
	int intval;
	bool translationset = false;
	bool fillcolorset = false;

	if (!fortext)
	{
		if (img == NULL || img->UseType == FTexture::TEX_Null)
		{
			va_end(tags);
			return false;
		}
	}

	// Do some sanity checks on the coordinates.
	if (x < -16383 || x > 16383 || y < -16383 || y > 16383)
	{
		va_end(tags);
		return false;
	}

	parms->fortext = fortext;
	parms->windowleft = 0;
	parms->windowright = INT_MAX;
	parms->dclip = this->GetHeight();
	parms->uclip = 0;
	parms->lclip = 0;
	parms->rclip = this->GetWidth();
	parms->left = INT_MAX;
	parms->top = INT_MAX;
	parms->destwidth = INT_MAX;
	parms->destheight = INT_MAX;
	parms->Alpha = 1.f;
	parms->fillcolor = -1;
	parms->remap = NULL;
	parms->colorOverlay = 0;
	parms->alphaChannel = false;
	parms->flipX = false;
	parms->shadowAlpha = 0;
	parms->shadowColor = 0;
	parms->virtWidth = this->GetWidth();
	parms->virtHeight = this->GetHeight();
	parms->keepratio = false;
	parms->style.BlendOp = 255;		// Dummy "not set" value
	parms->masked = true;
	parms->bilinear = false;
	parms->specialcolormap = NULL;
	parms->colormapstyle = NULL;
	parms->cleanmode = DTA_Base;
	parms->scalex = parms->scaley = 1;
	parms->cellx = parms->celly = 0;
	parms->maxstrlen = INT_MAX;
	parms->virtBottom = false;

	// Parse the tag list for attributes. (For floating point attributes,
	// consider that the C ABI dictates that all floats be promoted to
	// doubles when passed as function arguments.)
	while (tag != TAG_DONE)
	{
		DWORD data;

		switch (tag)
		{
		default:
			data = va_arg(tags, DWORD);
			break;

		case DTA_DestWidth:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destwidth = va_arg(tags, int);
			break;

		case DTA_DestWidthF:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destwidth = va_arg(tags, double);
			break;

		case DTA_DestHeight:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destheight = va_arg(tags, int);
			break;

		case DTA_DestHeightF:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destheight = va_arg(tags, double);
			break;

		case DTA_Clean:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = 1;
				parms->scaley = 1;
				parms->cleanmode = tag;
			}
			break;

		case DTA_CleanNoMove:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = CleanXfac;
				parms->scaley = CleanYfac;
				parms->cleanmode = tag;
			}
			break;

		case DTA_CleanNoMove_1:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = CleanXfac_1;
				parms->scaley = CleanYfac_1;
				parms->cleanmode = tag;
			}
			break;

		case DTA_320x200:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->cleanmode = DTA_Base;
				parms->scalex = 1;
				parms->scaley = 1;
				parms->virtWidth = 320;
				parms->virtHeight = 200;
			}
			break;

		case DTA_Bottom320x200:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->cleanmode = DTA_Base;
				parms->scalex = 1;
				parms->scaley = 1;
				parms->virtWidth = 320;
				parms->virtHeight = 200;
			}
			parms->virtBottom = true;
			break;

		case DTA_HUDRules:
			intval = va_arg(tags, int);
			parms->cleanmode = intval == HUD_HorizCenter ? DTA_HUDRulesC : DTA_HUDRules;
			break;

		case DTA_VirtualWidth:
			parms->cleanmode = DTA_Base;
			parms->virtWidth = va_arg(tags, int);
			break;

		case DTA_VirtualWidthF:
			parms->cleanmode = DTA_Base;
			parms->virtWidth = va_arg(tags, double);
			break;
			
		case DTA_VirtualHeight:
			parms->cleanmode = DTA_Base;
			parms->virtHeight = va_arg(tags, int);
			break;

		case DTA_VirtualHeightF:
			parms->cleanmode = DTA_Base;
			parms->virtHeight = va_arg(tags, double);
			break;

		case DTA_Fullscreen:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				assert(fortext == false);
				if (img == NULL) return false;
				parms->cleanmode = DTA_Fullscreen;
				parms->virtWidth = img->GetScaledWidthDouble();
				parms->virtHeight = img->GetScaledHeightDouble();
			}
			break;

		case DTA_Alpha:
			parms->Alpha = FIXED2FLOAT(MIN<fixed_t>(OPAQUE, va_arg (tags, fixed_t)));
			break;

		case DTA_AlphaF:
			parms->Alpha = (float)(MIN<double>(1., va_arg(tags, double)));
			break;

		case DTA_AlphaChannel:
			parms->alphaChannel = va_arg(tags, INTBOOL);
			break;

		case DTA_FillColor:
			parms->fillcolor = va_arg(tags, uint32);
			fillcolorset = true;
			break;

		case DTA_Translation:
			parms->remap = va_arg(tags, FRemapTable *);
			if (parms->remap != NULL && parms->remap->Inactive)
			{ // If it's inactive, pretend we were passed NULL instead.
				parms->remap = NULL;
			}
			break;

		case DTA_ColorOverlay:
			parms->colorOverlay = va_arg(tags, DWORD);
			break;

		case DTA_FlipX:
			parms->flipX = va_arg(tags, INTBOOL);
			break;

		case DTA_TopOffset:
			assert(fortext == false);
			if (fortext) return false;
			parms->top = va_arg(tags, int);
			break;

		case DTA_TopOffsetF:
			assert(fortext == false);
			if (fortext) return false;
			parms->top = va_arg(tags, double);
			break;

		case DTA_LeftOffset:
			assert(fortext == false);
			if (fortext) return false;
			parms->left = va_arg(tags, int);
			break;

		case DTA_LeftOffsetF:
			assert(fortext == false);
			if (fortext) return false;
			parms->left = va_arg(tags, double);
			break;

		case DTA_CenterOffset:
			assert(fortext == false);
			if (fortext) return false;
			if (va_arg(tags, int))
			{
				parms->left = img->GetScaledWidthDouble() * 0.5;
				parms->top = img->GetScaledHeightDouble() * 0.5;
			}
			break;

		case DTA_CenterBottomOffset:
			assert(fortext == false);
			if (fortext) return false;
			if (va_arg(tags, int))
			{
				parms->left = img->GetScaledWidthDouble() * 0.5;
				parms->top = img->GetScaledHeightDouble();
			}
			break;

		case DTA_WindowLeft:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowleft = va_arg(tags, int);
			break;

		case DTA_WindowLeftF:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowleft = va_arg(tags, double);
			break;

		case DTA_WindowRight:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowright = va_arg(tags, int);
			break;

		case DTA_WindowRightF:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowright = va_arg(tags, double);
			break;

		case DTA_ClipTop:
			parms->uclip = va_arg(tags, int);
			if (parms->uclip < 0)
			{
				parms->uclip = 0;
			}
			break;

		case DTA_ClipBottom:
			parms->dclip = va_arg(tags, int);
			if (parms->dclip > this->GetHeight())
			{
				parms->dclip = this->GetHeight();
			}
			break;

		case DTA_ClipLeft:
			parms->lclip = va_arg(tags, int);
			if (parms->lclip < 0)
			{
				parms->lclip = 0;
			}
			break;

		case DTA_ClipRight:
			parms->rclip = va_arg(tags, int);
			if (parms->rclip > this->GetWidth())
			{
				parms->rclip = this->GetWidth();
			}
			break;

		case DTA_ShadowAlpha:
			parms->shadowAlpha = MIN<fixed_t>(OPAQUE, va_arg (tags, fixed_t));
			break;

		case DTA_ShadowColor:
			parms->shadowColor = va_arg(tags, int);
			break;

		case DTA_Shadow:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->shadowAlpha = FRACUNIT/2;
				parms->shadowColor = 0;
			}
			else
			{
				parms->shadowAlpha = 0;
			}
			break;

		case DTA_Masked:
			parms->masked = va_arg(tags, INTBOOL);
			break;

		case DTA_BilinearFilter:
			parms->bilinear = va_arg(tags, INTBOOL);
			break;

		case DTA_KeepRatio:
			// I think this is a terribly misleading name, since it actually turns
			// *off* aspect ratio correction.
			parms->keepratio = va_arg(tags, INTBOOL);
			break;

		case DTA_RenderStyle:
			parms->style.AsDWORD = va_arg(tags, DWORD);
			break;

		case DTA_SpecialColormap:
			parms->specialcolormap = va_arg(tags, FSpecialColormap *);
			break;

		case DTA_ColormapStyle:
			parms->colormapstyle = va_arg(tags, FColormapStyle *);
			break;

		case DTA_TextLen:
			parms->maxstrlen = va_arg(tags, int);
			break;

		case DTA_CellX:
			parms->cellx = va_arg(tags, int);
			break;

		case DTA_CellY:
			parms->celly = va_arg(tags, int);
			break;

		}
		tag = va_arg(tags, DWORD);
	}
	va_end (tags);

	if (parms->uclip >= parms->dclip || parms->lclip >= parms->rclip)
	{
		return false;
	}

	if (img != NULL)
	{
		SetTextureParms(parms, img, x, y);

		if (parms->destwidth <= 0 || parms->destheight <= 0)
		{
			return false;
		}
	}

	if (parms->style.BlendOp == 255)
	{
		if (fillcolorset)
		{
			if (parms->alphaChannel)
			{
				parms->style = STYLE_Shaded;
			}
			else if (parms->Alpha < 1.f)
			{
				parms->style = STYLE_TranslucentStencil;
			}
			else
			{
				parms->style = STYLE_Stencil;
			}
		}
		else if (parms->Alpha < 1.f)
		{
			parms->style = STYLE_Translucent;
		}
		else
		{
			parms->style = STYLE_Normal;
		}
	}
	return true;
}